

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderFailIfExtraTestcommentAfterObject::runTestCase
          (TestCharReaderFailIfExtraTestcommentAfterObject *this)

{
  TestResult *pTVar1;
  int iVar2;
  Value *pVVar3;
  CharReader *pCVar4;
  allocator local_151;
  string errs;
  string local_130;
  string local_110;
  Value root;
  char doc [47];
  CharReaderBuilder b;
  Value local_68;
  Value local_40;
  
  Json::CharReaderBuilder::CharReaderBuilder(&b);
  Json::Value::Value(&root,nullValue);
  builtin_strncpy(doc + 0x10,"value\" } //trailing\n//comment\n",0x1f);
  builtin_strncpy(doc,"{ \"property\" : \"",0x10);
  Json::Value::Value(&local_40,true);
  pVVar3 = Json::Value::operator[](&b.settings_,"failIfExtra");
  Json::Value::operator=(pVVar3,&local_40);
  Json::Value::~Value(&local_40);
  pCVar4 = Json::CharReaderBuilder::newCharReader(&b);
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  iVar2 = (*pCVar4->_vptr_CharReader[2])(pCVar4,doc,doc + 0x2e,&root,&errs);
  if ((char)iVar2 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderFailIfExtraTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x7c8,"ok");
  }
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_110,"",&local_151);
  std::__cxx11::string::string((string *)&local_130,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,&local_110,&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7c9,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  pVVar3 = Json::Value::operator[](&root,"property");
  Json::Value::Value(&local_68,pVVar3);
  JsonTest::checkEqual<char_const*,Json::Value>
            (pTVar1,"value",&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7ca,"\"value\" == root[\"property\"]");
  Json::Value::~Value(&local_68);
  (*pCVar4->_vptr_CharReader[1])(pCVar4);
  std::__cxx11::string::~string((string *)&errs);
  Json::Value::~Value(&root);
  Json::CharReaderBuilder::~CharReaderBuilder(&b);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterObject) {
  Json::CharReaderBuilder b;
  Json::Value root;
  {
  char const doc[] =
      "{ \"property\" : \"value\" } //trailing\n//comment\n";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL("value", root["property"]);
  delete reader;
  }
}